

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
decodeOneStep(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             char *filename)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_49;
  string local_48 [32];
  uint local_28;
  uint local_24;
  uint error;
  uint height;
  uint width;
  char *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *image;
  
  height._3_1_ = 0;
  _width = filename;
  filename_local = (char *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  pcVar3 = _width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar3,&local_49);
  uVar1 = lodepng::decode(__return_storage_ptr__,&error,&local_24,(string *)local_48,LCT_RGBA,8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (uVar1 != 0) {
    local_28 = uVar1;
    poVar2 = std::operator<<((ostream *)&std::cout,"decoder error ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2,": ");
    pcVar3 = lodepng_error_text(local_28);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> decodeOneStep(const char* filename)
{
    std::vector<unsigned char> image; //the raw pixels
    unsigned width, height;
    
    //decode
    unsigned error = lodepng::decode(image, width, height, filename);
    
    //if there's an error, display it
    if(error) std::cout << "decoder error " << error << ": " << lodepng_error_text(error) << std::endl;
    return image;
}